

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandDemiter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Abc_Ntk_t *pNtk_00;
  char *pcVar4;
  uint local_3c;
  int fVerbose;
  int fDual;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  bVar1 = false;
  local_3c = 1;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar2 = Extra_UtilGetopt(argc,argv,"dvh");
      if (iVar2 == -1) {
        if (pNtk_00 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          pAbc_local._4_4_ = 1;
        }
        else {
          iVar2 = Abc_NtkIsStrash(pNtk_00);
          if (iVar2 == 0) {
            Abc_Print(-1,"The network is not strashed.\n");
            pAbc_local._4_4_ = 1;
          }
          else if (bVar1) {
            uVar3 = Abc_NtkPoNum(pNtk_00);
            if ((uVar3 & 1) == 0) {
              iVar2 = Abc_NtkDarDemiterDual(pNtk_00,local_3c);
              if (iVar2 == 0) {
                Abc_Print(-1,"Demitering has failed.\n");
                pAbc_local._4_4_ = 1;
              }
              else {
                pAbc_local._4_4_ = 0;
              }
            }
            else {
              Abc_Print(-1,"The number of POs should be even.\n");
              pAbc_local._4_4_ = 0;
            }
          }
          else {
            iVar2 = Abc_NtkDarDemiter(pNtk_00);
            if (iVar2 == 0) {
              Abc_Print(-1,"Demitering has failed.\n");
              pAbc_local._4_4_ = 1;
            }
            else {
              pAbc_local._4_4_ = 0;
            }
          }
        }
        return pAbc_local._4_4_;
      }
      if (iVar2 != 100) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar2 != 0x76) break;
    local_3c = local_3c ^ 1;
  }
  Abc_Print(-2,"usage: demiter [-dvh]\n");
  Abc_Print(-2,"\t        splits sequential miter into two circuits\n");
  pcVar4 = "no";
  if (bVar1) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-d    : expects a dual-output miter (without XORs) [default = %s]\n",pcVar4);
  pcVar4 = "no";
  if (local_3c != 0) {
    pcVar4 = "yes";
  }
  Abc_Print(-2,"\t-v    : toggles outputting verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t-h    : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandDemiter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fDual, fVerbose;
    extern int Abc_NtkDarDemiter( Abc_Ntk_t * pNtk );
    extern int Abc_NtkDarDemiterDual( Abc_Ntk_t * pNtk, int fVerbose );
    // set defaults
    fDual = 0;
    fVerbose = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "dvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'd':
            fDual ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "The network is not strashed.\n" );
        return 1;
    }

    if ( fDual )
    {
        if ( (Abc_NtkPoNum(pNtk) & 1) )
        {
            Abc_Print( -1, "The number of POs should be even.\n" );
            return 0;
        }
        if ( !Abc_NtkDarDemiterDual( pNtk, fVerbose ) )
        {
            Abc_Print( -1, "Demitering has failed.\n" );
            return 1;
        }
        return 0;
    }
/*
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "The network is not a single-output miter.\n" );
        return 1;
    }
    if ( !Abc_NodeIsExorType(Abc_ObjFanin0(Abc_NtkPo(pNtk,0))) )
    {
        Abc_Print( -1, "The miter's PO is not an EXOR.\n" );
        return 1;
    }
    if ( !Abc_NtkDemiter( pNtk ) )
    {
        Abc_Print( -1, "Demitering has failed.\n" );
        return 1;
    }
*/
    // get the new network
    if ( !Abc_NtkDarDemiter( pNtk ) )
    {
        Abc_Print( -1, "Demitering has failed.\n" );
        return 1;
    }
    // replace the current network
//    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: demiter [-dvh]\n" );
    Abc_Print( -2, "\t        splits sequential miter into two circuits\n" );
    Abc_Print( -2, "\t-d    : expects a dual-output miter (without XORs) [default = %s]\n", fDual? "yes": "no" );
    Abc_Print( -2, "\t-v    : toggles outputting verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}